

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int print_regmat_cnt(char *fn)

{
  int32 iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint32 *veclen;
  uint32 n_feat;
  uint32 n_mllr_class;
  float32 ***regr;
  float32 ****regl;
  uint32 *local_50;
  uint local_48;
  uint local_44;
  float32 ***local_40;
  float32 ****local_38;
  
  iVar1 = read_reg_mat(fn,&local_50,&local_44,&local_48,&local_38,&local_40);
  iVar2 = -1;
  if (iVar1 == 0) {
    if (local_44 != 0) {
      uVar3 = (ulong)local_48;
      uVar6 = 0;
      uVar4 = local_44;
      do {
        iVar2 = (int)uVar3;
        uVar3 = 0;
        if (iVar2 != 0) {
          uVar7 = 0;
          do {
            printf("%d\n",(ulong)local_50[uVar7]);
            if (local_50[uVar7] != 0) {
              uVar3 = 1;
              uVar5 = 0;
              do {
                if ((int)uVar3 != 0) {
                  uVar3 = 0;
                  do {
                    printf("%f ",(double)(float)local_38[uVar6][uVar7][uVar5][uVar3]);
                    uVar3 = uVar3 + 1;
                  } while (uVar3 < local_50[uVar7]);
                }
                putchar(10);
                uVar5 = uVar5 + 1;
                uVar3 = (ulong)local_50[uVar7];
              } while (uVar5 < uVar3);
              if (local_50[uVar7] != 0) {
                uVar3 = 0;
                do {
                  printf("%f ",(double)(float)local_40[uVar6][uVar7][uVar3]);
                  uVar3 = uVar3 + 1;
                } while (uVar3 < local_50[uVar7]);
              }
            }
            putchar(10);
            if (local_50[uVar7] != 0) {
              uVar4 = 0;
              do {
                printf("1.0 ");
                uVar4 = uVar4 + 1;
              } while (uVar4 < local_50[uVar7]);
            }
            putchar(10);
            uVar7 = uVar7 + 1;
            uVar3 = (ulong)local_48;
            uVar4 = local_44;
          } while (uVar7 < uVar3);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar4);
    }
    ckd_free(local_50);
    free_mllr_reg(&local_38,&local_40,local_44,local_48);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
print_regmat_cnt(const char *fn)
{
    float32 ****regl;
    float32 ***regr;
    uint32 n_mllr_class;
    uint32 n_feat;
    uint32 *veclen;
    uint32 c, f, j, k;

    if (read_reg_mat (fn, &veclen, &n_mllr_class, &n_feat, &regl, &regr) != S3_SUCCESS) {
	return S3_ERROR;
    }

    for (c = 0; c < n_mllr_class; c++) {
	for (f = 0; f < n_feat; f++) {
	    printf("%d\n", veclen[f]); 
	    for (j = 0; j < veclen[f]; j++) {
		for (k = 0; k < veclen[f]; ++k) {
		    printf("%f ", regl[c][f][j][k]);
		}
		printf("\n");
	    }
	    for (j = 0; j < veclen[f]; j++) {
		printf("%f ", regr[c][f][j]);
	    }
	    printf("\n");
	    /* Identity transform for variances. */
	    for (j = 0; j < veclen[f]; j++) {
		printf("1.0 ");
	    }
	    printf("\n");
	}
    }
    ckd_free(veclen);

    free_mllr_reg(&regl, &regr, n_mllr_class, n_feat);

    return S3_SUCCESS;
}